

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O2

Vector3f __thiscall pbrt::Frame::FromLocal(Frame *this,Vector3f *v)

{
  Vector3<float> VVar1;
  Vector3<float> VVar2;
  Vector3<float> VVar3;
  Vector3f VVar4;
  float local_38;
  float fStack_34;
  float local_28;
  float fStack_24;
  
  VVar1 = Tuple3<pbrt::Vector3,float>::operator*
                    ((Tuple3<pbrt::Vector3,float> *)this,(v->super_Tuple3<pbrt::Vector3,_float>).x);
  VVar2 = Tuple3<pbrt::Vector3,float>::operator*
                    ((Tuple3<pbrt::Vector3,float> *)&this->y,
                     (v->super_Tuple3<pbrt::Vector3,_float>).y);
  VVar3 = Tuple3<pbrt::Vector3,float>::operator*
                    ((Tuple3<pbrt::Vector3,float> *)&this->z,
                     (v->super_Tuple3<pbrt::Vector3,_float>).z);
  local_38 = VVar2.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_34 = VVar2.super_Tuple3<pbrt::Vector3,_float>.y;
  local_28 = VVar1.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_24 = VVar1.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar4.super_Tuple3<pbrt::Vector3,_float>.x =
       local_38 + local_28 + VVar3.super_Tuple3<pbrt::Vector3,_float>.x;
  VVar4.super_Tuple3<pbrt::Vector3,_float>.y =
       fStack_34 + fStack_24 + VVar3.super_Tuple3<pbrt::Vector3,_float>.y;
  VVar4.super_Tuple3<pbrt::Vector3,_float>.z =
       VVar3.super_Tuple3<pbrt::Vector3,_float>.z +
       VVar2.super_Tuple3<pbrt::Vector3,_float>.z + VVar1.super_Tuple3<pbrt::Vector3,_float>.z;
  return (Vector3f)VVar4.super_Tuple3<pbrt::Vector3,_float>;
}

Assistant:

PBRT_CPU_GPU
    Vector3f FromLocal(const Vector3f &v) const { return v.x * x + v.y * y + v.z * z; }